

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O2

void __thiscall duckdb::Bit::BitToNumeric<signed_char>(Bit *this,bitstring_t bit,char *output_num)

{
  uint8_t uVar1;
  char *pcVar2;
  anon_union_16_2_67f50693_for_value local_20;
  
  pcVar2 = bit.value._8_8_;
  local_20.pointer.ptr = (char *)bit.value._0_8_;
  *pcVar2 = '\0';
  local_20._0_8_ = this;
  uVar1 = GetFirstByte((bitstring_t *)&local_20.pointer);
  pcVar2[((ulong)this & 0xffffffff) - 2] = uVar1;
  if (((ulong)this & 0xffffffff) == 3) {
    *pcVar2 = local_20.pointer.prefix[2];
  }
  return;
}

Assistant:

void Bit::BitToNumeric(bitstring_t bit, T &output_num) {
	D_ASSERT(bit.GetSize() <= sizeof(T) + 1);

	output_num = 0;
	auto data = const_data_ptr_cast(bit.GetData());
	auto output = data_ptr_cast(&output_num);

	idx_t padded_byte_idx = sizeof(T) - bit.GetSize() + 1;
	output[sizeof(T) - 1 - padded_byte_idx] = GetFirstByte(bit);
	for (idx_t idx = padded_byte_idx + 1; idx < sizeof(T); ++idx) {
		output[sizeof(T) - 1 - idx] = data[1 + idx - padded_byte_idx];
	}
}